

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O1

void getPath(long path)

{
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  int prevChecked [1152];
  undefined8 auStack_1708 [158];
  int local_1218 [1152];
  
  bVar7 = 0;
  iVar1 = 0;
  memset(local_1218,0,0x1200);
  *(undefined4 *)(path + 8) = 0;
  puVar3 = &stack0x00000054;
  lVar4 = 0;
  do {
    lVar2 = 0;
    do {
      if (puVar3[lVar2] == '$') {
        iVar1 = (int)lVar2 - iVar1;
        local_1218[0] = iVar1;
        goto LAB_001028cd;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x48);
    lVar4 = lVar4 + 1;
    iVar1 = iVar1 + -0x48;
    puVar3 = puVar3 + 0x49;
  } while (lVar4 != 0x10);
  iVar1 = 0;
LAB_001028cd:
  puVar5 = (undefined8 *)&stack0x00000008;
  puVar6 = auStack_1708;
  for (lVar4 = 0x9e; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  pathSolve(path,local_1218,1,iVar1);
  return;
}

Assistant:

void getPath(struct Path *path, struct Map map) {
    int i, j;
    int count = 0;
    int position = 0;
    int prevChecked[MAP_ROWS * MAP_COLS];

    for (i = 0; i < (MAP_ROWS * MAP_COLS); i++)
        prevChecked[i] = 0;
    path->count = 0;
    for (i = 0; i < MAP_ROWS; i++) {
        for (j = 0; j < MAP_COLS; j++) {
            if (map.overlay[i][j] == '$') {
                position = (i * MAP_COLS) + j;
                count = 0;
                prevChecked[count] = position;
                goto outer;
            }
        }
    }

    outer:
    pathSolve(map, path, prevChecked, count + 1, position);

    return;
}